

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_p.h
# Opt level: O0

void __thiscall QProcEnvValue::~QProcEnvValue(QProcEnvValue *this)

{
  QString::~QString((QString *)0x794820);
  QByteArray::~QByteArray((QByteArray *)0x79482a);
  return;
}

Assistant:

QProcEnvValue() = default;